

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O0

CURLcode rtsp_rtp_write_resp(Curl_easy *data,char *buf,size_t blen,_Bool is_eos)

{
  connectdata *pcVar1;
  uint uVar2;
  size_t local_40;
  size_t consumed;
  anon_union_280_10_9f9d5394_for_proto *paStack_30;
  CURLcode result;
  rtsp_conn *rtspc;
  size_t sStack_20;
  _Bool is_eos_local;
  size_t blen_local;
  char *buf_local;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  paStack_30 = &pcVar1->proto;
  consumed._4_4_ = CURLE_OK;
  local_40 = 0;
  if ((*(uint *)&(data->req).field_0xd9 & 1) == 0) {
    *(byte *)((long)&pcVar1->proto + 0x34) = *(byte *)((long)&pcVar1->proto + 0x34) & 0xfe;
  }
  buf_local = (char *)data;
  if (blen != 0) {
    rtspc._7_1_ = is_eos;
    sStack_20 = blen;
    blen_local = (size_t)buf;
    if ((*(byte *)((long)&pcVar1->proto + 0x34) & 1) == 0) {
      consumed._4_4_ = rtsp_filter_rtp(data,buf,blen,&local_40);
      if (consumed._4_4_ != CURLE_OK) goto LAB_00177e44;
      blen_local = local_40 + blen_local;
      sStack_20 = sStack_20 - local_40;
    }
    if (((*(uint *)(buf_local + 0x1c9) & 1) != 0) && (sStack_20 != 0)) {
      *(byte *)((long)paStack_30 + 0x34) = *(byte *)((long)paStack_30 + 0x34) & 0xfe | 1;
      consumed._4_4_ =
           Curl_http_write_resp_hds((Curl_easy *)buf_local,(char *)blen_local,sStack_20,&local_40);
      if (consumed._4_4_ != CURLE_OK) goto LAB_00177e44;
      blen_local = local_40 + blen_local;
      sStack_20 = sStack_20 - local_40;
      if ((*(uint *)(buf_local + 0x1c9) & 1) == 0) {
        *(byte *)((long)paStack_30 + 0x34) = *(byte *)((long)paStack_30 + 0x34) & 0xfe;
      }
      if ((*(byte *)((long)paStack_30 + 0x34) & 1) == 0) {
        if (0x7fffffffffffffff < *(ulong *)(buf_local + 0xf0)) {
          buf_local[0xf0] = '\0';
          buf_local[0xf1] = '\0';
          buf_local[0xf2] = '\0';
          buf_local[0xf3] = '\0';
          buf_local[0xf4] = '\0';
          buf_local[0xf5] = '\0';
          buf_local[0xf6] = '\0';
          buf_local[0xf7] = '\0';
          *(uint *)(buf_local + 0x1c9) = *(uint *)(buf_local + 0x1c9) & 0xfffffff7 | 8;
        }
        consumed._4_4_ =
             rtsp_filter_rtp((Curl_easy *)buf_local,(char *)blen_local,sStack_20,&local_40);
        if (consumed._4_4_ != CURLE_OK) goto LAB_00177e44;
        sStack_20 = sStack_20 - local_40;
      }
    }
    if ((paStack_30->rtspc).state != RTP_PARSE_SKIP) {
      *(uint *)(buf_local + 0x1c9) = *(uint *)(buf_local + 0x1c9) & 0xfffffffd;
    }
    if ((consumed._4_4_ == CURLE_OK) && (((rtspc._7_1_ & 1) != 0 || (sStack_20 != 0)))) {
      uVar2 = 0;
      if ((rtspc._7_1_ & 1) != 0) {
        uVar2 = 0x80;
      }
      consumed._4_4_ =
           Curl_client_write((Curl_easy *)buf_local,uVar2 | 1,(char *)blen_local,sStack_20);
    }
  }
LAB_00177e44:
  if ((*(int *)(buf_local + 0x9f8) == 0xb) && ((paStack_30->rtspc).state == RTP_PARSE_SKIP)) {
    *(uint *)(buf_local + 0x1c9) = *(uint *)(buf_local + 0x1c9) & 0xfffffff7 | 8;
  }
  return consumed._4_4_;
}

Assistant:

static CURLcode rtsp_rtp_write_resp(struct Curl_easy *data,
                                    const char *buf,
                                    size_t blen,
                                    bool is_eos)
{
  struct rtsp_conn *rtspc = &(data->conn->proto.rtspc);
  CURLcode result = CURLE_OK;
  size_t consumed = 0;

  if(!data->req.header)
    rtspc->in_header = FALSE;
  if(!blen) {
    goto out;
  }

  DEBUGF(infof(data, "rtsp_rtp_write_resp(len=%zu, in_header=%d, eos=%d)",
               blen, rtspc->in_header, is_eos));

  /* If header parsing is not ongoing, extract RTP messages */
  if(!rtspc->in_header) {
    result = rtsp_filter_rtp(data, buf, blen, &consumed);
    if(result)
      goto out;
    buf += consumed;
    blen -= consumed;
    /* either we consumed all or are at the start of header parsing */
    if(blen && !data->req.header)
      DEBUGF(infof(data, "RTSP: %zu bytes, possibly excess in response body",
                   blen));
  }

  /* we want to parse headers, do so */
  if(data->req.header && blen) {
    rtspc->in_header = TRUE;
    result = Curl_http_write_resp_hds(data, buf, blen, &consumed);
    if(result)
      goto out;

    buf += consumed;
    blen -= consumed;

    if(!data->req.header)
      rtspc->in_header = FALSE;

    if(!rtspc->in_header) {
      /* If header parsing is done, extract interleaved RTP messages */
      if(data->req.size <= -1) {
        /* Respect section 4.4 of rfc2326: If the Content-Length header is
           absent, a length 0 must be assumed. */
        data->req.size = 0;
        data->req.download_done = TRUE;
      }
      result = rtsp_filter_rtp(data, buf, blen, &consumed);
      if(result)
        goto out;
      blen -= consumed;
    }
  }

  if(rtspc->state != RTP_PARSE_SKIP)
    data->req.done = FALSE;
  /* we SHOULD have consumed all bytes, unless the response is borked.
   * In which case we write out the left over bytes, letting the client
   * writer deal with it (it will report EXCESS and fail the transfer). */
  DEBUGF(infof(data, "rtsp_rtp_write_resp(len=%zu, in_header=%d, done=%d "
               " rtspc->state=%d, req.size=%" FMT_OFF_T ")",
               blen, rtspc->in_header, data->req.done, rtspc->state,
               data->req.size));
  if(!result && (is_eos || blen)) {
    result = Curl_client_write(data, CLIENTWRITE_BODY|
                               (is_eos ? CLIENTWRITE_EOS : 0),
                               (char *)buf, blen);
  }

out:
  if((data->set.rtspreq == RTSPREQ_RECEIVE) &&
     (rtspc->state == RTP_PARSE_SKIP)) {
    /* In special mode RECEIVE, we just process one chunk of network
     * data, so we stop the transfer here, if we have no incomplete
     * RTP message pending. */
    data->req.download_done = TRUE;
  }
  return result;
}